

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O3

bool __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinId>_>
::CheckDomainReturnFalseIfTrivial
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinId>_>
           *this,PLPoints *result)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  int iVar8;
  Error *this_00;
  undefined4 extraout_var;
  double *in_R9;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<double,_std::allocator<double>_> local_f8;
  vector<double,_std::allocator<double>_> local_d8;
  double local_c0;
  double local_b8;
  undefined8 local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  double local_30;
  char *local_28;
  
  local_b8 = this->lbx_;
  uVar9 = SUB84(local_b8,0);
  uVar10 = (undefined4)((ulong)local_b8 >> 0x20);
  dVar1 = this->ubx_;
  if (local_b8 <= dVar1 + 1e-06) {
    local_c0 = dVar1 + -1e-06;
    if (local_c0 < local_b8) {
      local_68._M_dataplus._M_p = (pointer)((dVar1 + local_b8) * 0.5);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_68;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_f8,__l,(allocator_type *)&local_88);
      (*this->_vptr_BasicPLApproximator[9])((this->lbx_ + this->ubx_) * 0.5,this);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_a8;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_d8,__l_00,(allocator_type *)&local_b0);
      pdVar7 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar6 = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar5 = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar4 = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      uVar9 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_;
      uVar10 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
      uVar11 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish._0_4_;
      uVar12 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish._4_4_;
      local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pdVar2 = (result->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (result->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (result->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = pdVar4;
      (result->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar5;
      (result->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pdVar6;
      if (pdVar2 != (pointer)0x0) {
        local_48 = uVar9;
        uStack_44 = uVar10;
        uStack_40 = uVar11;
        uStack_3c = uVar12;
        operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2);
        uVar9 = local_48;
        uVar10 = uStack_44;
        uVar11 = uStack_40;
        uVar12 = uStack_3c;
      }
      pdVar2 = (result->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (result->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      *(undefined4 *)
       &(result->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = uVar9;
      *(undefined4 *)
       ((long)&(result->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 4) = uVar10;
      *(undefined4 *)
       &(result->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = uVar11;
      *(undefined4 *)
       ((long)&(result->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 4) = uVar12;
      (result->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pdVar7;
      if (pdVar2 != (pointer)0x0) {
        operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2);
      }
      if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar9 = SUB84(local_b8,0);
      uVar10 = (undefined4)((ulong)local_b8 >> 0x20);
    }
    return (double)CONCAT44(uVar10,uVar9) < local_c0 || (double)CONCAT44(uVar10,uVar9) == local_c0;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Model infeasible: ","");
  iVar8 = (*this->_vptr_BasicPLApproximator[2])(this);
  local_b0 = CONCAT44(extraout_var,iVar8);
  local_28 = (char *)this->lbx_;
  local_30 = this->ubx_;
  fmt::format<char_const*,double,double>
            (&local_88,(fmt *)"PLApprox {}: empty argument domain [{}, {}]",(CStringRef)&local_b0,
             &local_28,&local_30,in_R9);
  std::operator+(&local_68,&local_a8,&local_88);
  Error::Error(this_00,(CStringRef)local_68._M_dataplus._M_p,200);
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

bool BasicPLApproximator<FuncCon>::CheckDomainReturnFalseIfTrivial(
    PLPoints& result) {
  if (lbx() > ubx()+1e-6)
    MP_INFEAS(fmt::format("PLApprox {}: "
                          "empty argument domain [{}, {}]",
                          GetConTypeName(), lbx(), ubx()));
  /// Domain ~ single point
  if (lbx() > ubx()-1e-6) {
    result = { {(lbx()+ubx())/2.0}, {eval((lbx()+ubx())/2.0)} };
    return false;
  }
  return true;
}